

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

ostream * sciplot::gnuplot::palettecmd(ostream *out,string *palette)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  
  poVar1 = std::operator<<(out,
                           "#=============================================================================="
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"# GNUPLOT-palette (");
  poVar1 = std::operator<<(poVar1,(string *)palette);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,
                           "#------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"# see more at https://github.com/Gnuplotting/gnuplot-palettes");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,
                           "#=============================================================================="
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)palettes_abi_cxx11_,palette);
  poVar1 = std::operator<<(out,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return out;
}

Assistant:

inline auto palettecmd(std::ostream& out, std::string palette) -> std::ostream&
{
    out << "#==============================================================================" << std::endl;
    out << "# GNUPLOT-palette (" << palette << ")" << std::endl;
    out << "#------------------------------------------------------------------------------" << std::endl;
    out << "# see more at https://github.com/Gnuplotting/gnuplot-palettes" << std::endl;
    out << "#==============================================================================" << std::endl;
    out << palettes.at(palette) << std::endl;
    return out;
}